

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O0

Vec_Str_t *
Cec_ManSatSolveSeq(Vec_Ptr_t *vPatts,Gia_Man_t *pAig,Cec_ParSat_t *pPars,int nRegs,int *pnPats)

{
  FILE *pFile;
  int iVar1;
  int iVar2;
  abctime aVar3;
  Cec_ManSat_t *p_00;
  Vec_Str_t *p_01;
  Bar_Progress_t *p_02;
  Gia_Obj_t *pGVar4;
  abctime aVar5;
  bool bVar6;
  int nWords;
  abctime clk;
  int local_60;
  int status;
  int i;
  int nPats;
  int nPatsInit;
  int iPat;
  Gia_Obj_t *pObj;
  Cec_ManSat_t *p;
  Vec_Str_t *vStatus;
  Bar_Progress_t *pProgress;
  int *pnPats_local;
  int nRegs_local;
  Cec_ParSat_t *pPars_local;
  Gia_Man_t *pAig_local;
  Vec_Ptr_t *vPatts_local;
  
  nPats = 0;
  aVar3 = Abc_Clock();
  iVar1 = Vec_PtrReadWordsSimInfo(vPatts);
  Gia_ManSetPhase(pAig);
  Gia_ManLevelNum(pAig);
  Gia_ManIncrementTravId(pAig);
  p_00 = Cec_ManSatCreate(pAig,pPars);
  iVar2 = Gia_ManPoNum(pAig);
  p_01 = Vec_StrAlloc(iVar2);
  pFile = _stdout;
  iVar2 = Gia_ManPoNum(pAig);
  p_02 = Bar_ProgressStart(pFile,iVar2);
  local_60 = 0;
  status = iVar1 << 5;
  while( true ) {
    iVar2 = Vec_IntSize(pAig->vCos);
    bVar6 = false;
    if (local_60 < iVar2) {
      _nPatsInit = Gia_ManCo(pAig,local_60);
      bVar6 = _nPatsInit != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    Bar_ProgressUpdate(p_02,local_60,"SAT...");
    pGVar4 = Gia_ObjFanin0(_nPatsInit);
    iVar2 = Gia_ObjIsConst0(pGVar4);
    if (iVar2 == 0) {
      pGVar4 = Gia_ObjChild0(_nPatsInit);
      iVar2 = Cec_ManSatCheckNode(p_00,pGVar4);
      Vec_StrPush(p_01,(char)iVar2);
      if (iVar2 == 0) {
        if (nPats == status) {
          iVar2 = Vec_PtrReadWordsSimInfo(vPatts);
          Vec_PtrReallocSimInfo(vPatts);
          Vec_PtrCleanSimInfo(vPatts,iVar2,iVar2 << 1);
          iVar2 = Vec_PtrReadWordsSimInfo(vPatts);
          status = iVar2 << 5;
        }
        if (nPats % (iVar1 << 5) == 0) {
          nPats = nPats + 1;
        }
        Gia_ManIncrementTravId(pAig);
        pGVar4 = Gia_ObjFanin0(_nPatsInit);
        Cec_ManSatSolveSeq_rec(p_00,pAig,pGVar4,vPatts,nPats,nRegs);
        nPats = nPats + 1;
      }
    }
    else {
      iVar2 = Gia_ObjFaninC0(_nPatsInit);
      if (iVar2 == 0) {
        Vec_StrPush(p_01,'\x01');
      }
      else {
        Vec_StrPush(p_01,'\0');
      }
    }
    local_60 = local_60 + 1;
  }
  aVar5 = Abc_Clock();
  p_00->timeTotal = (int)aVar5 - (int)aVar3;
  Bar_ProgressStop(p_02);
  if (pPars->fVerbose != 0) {
    Cec_ManSatPrintStats(p_00);
  }
  Cec_ManSatStop(p_00);
  if (pnPats != (int *)0x0) {
    *pnPats = nPats + -1;
  }
  return p_01;
}

Assistant:

Vec_Str_t * Cec_ManSatSolveSeq( Vec_Ptr_t * vPatts, Gia_Man_t * pAig, Cec_ParSat_t * pPars, int nRegs, int * pnPats )
{
    Bar_Progress_t * pProgress = NULL;
    Vec_Str_t * vStatus;
    Cec_ManSat_t * p;
    Gia_Obj_t * pObj;
    int iPat = 0, nPatsInit, nPats;
    int i, status;
    abctime clk = Abc_Clock();
    nPatsInit = nPats = 32 * Vec_PtrReadWordsSimInfo(vPatts);
    Gia_ManSetPhase( pAig );
    Gia_ManLevelNum( pAig );
    Gia_ManIncrementTravId( pAig );
    p = Cec_ManSatCreate( pAig, pPars );
    vStatus = Vec_StrAlloc( Gia_ManPoNum(pAig) );
    pProgress = Bar_ProgressStart( stdout, Gia_ManPoNum(pAig) );
    Gia_ManForEachCo( pAig, pObj, i )
    {
        Bar_ProgressUpdate( pProgress, i, "SAT..." );
        if ( Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
        {
            if ( Gia_ObjFaninC0(pObj) )
            {
//                Abc_Print( 1, "Constant 1 output of SRM!!!\n" );
                Vec_StrPush( vStatus, 0 );
            }
            else
            {
//                Abc_Print( 1, "Constant 0 output of SRM!!!\n" );
                Vec_StrPush( vStatus, 1 );
            }
            continue;
        }
        status = Cec_ManSatCheckNode( p, Gia_ObjChild0(pObj) );
//Abc_Print( 1, "output %d   status = %d\n", i, status );
        Vec_StrPush( vStatus, (char)status );
        if ( status != 0 )
            continue;
        // resize storage
        if ( iPat == nPats )
        {
            int nWords = Vec_PtrReadWordsSimInfo(vPatts);
            Vec_PtrReallocSimInfo( vPatts );
            Vec_PtrCleanSimInfo( vPatts, nWords, 2*nWords );
            nPats = 32 * Vec_PtrReadWordsSimInfo(vPatts);
        }
        if ( iPat % nPatsInit == 0 )
            iPat++;
        // save the pattern
        Gia_ManIncrementTravId( pAig );
//        Vec_IntClear( p->vCex );
        Cec_ManSatSolveSeq_rec( p, pAig, Gia_ObjFanin0(pObj), vPatts, iPat++, nRegs );
//        Gia_SatVerifyPattern( pAig, pObj, p->vCex, p->vVisits );
//        Cec_ManSatAddToStore( p->vCexStore, p->vCex );
//        if ( iPat == nPats )
//            break;
        // quit if one of them is solved
//        if ( pPars->fFirstStop )
//            break;
//        if ( iPat == 32 * 15 * 16 - 1 )
//            break;
    }
    p->timeTotal = Abc_Clock() - clk;
    Bar_ProgressStop( pProgress );
    if ( pPars->fVerbose )
        Cec_ManSatPrintStats( p );
//    Abc_Print( 1, "Total number of cex literals = %d. (Ave = %d)\n", p->nCexLits, p->nCexLits/p->nSatSat );
    Cec_ManSatStop( p );
    if ( pnPats )
        *pnPats = iPat-1;
    return vStatus;
}